

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::Unregister
          (SubjectSetRegister *this,Subject *subject_to_unregister)

{
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  *this_00;
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  pVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->modified_ = true;
  this_00 = &this->subject_state_;
  iVar1 = std::
          _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
          ::find(&this_00->_M_t,subject_to_unregister);
  if (((_Rb_tree_header *)iVar1._M_node ==
       &(this->subject_state_)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar1._M_node[1]._M_right == 1)) {
    pVar2 = std::
            _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
            ::equal_range(&this_00->_M_t,subject_to_unregister);
    std::
    _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  }
  else {
    *(undefined4 *)&iVar1._M_node[1]._M_right = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void SubjectSetRegister::Unregister(const Subject& subject_to_unregister)
{
    std::unique_lock<std::mutex> lck(mutex_);
    modified_ = true;

    auto state = subject_state_.find(subject_to_unregister);

    if (state == subject_state_.end() || state->second.GetState() == STATE_NEWLY_SUBSCRIBED)
    {
        ClearSubjectState(subject_to_unregister);
    }
    else
    {
        state->second.SetState(STATE_UNSUBSCRIBED);
    }
}